

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_image_section_cache.c
# Opt level: O1

void pt_iscache_fini(pt_image_section_cache *iscache)

{
  if (iscache != (pt_image_section_cache *)0x0) {
    pt_iscache_clear(iscache);
    free(iscache->name);
    mtx_destroy(&iscache->lock);
    return;
  }
  return;
}

Assistant:

void pt_iscache_fini(struct pt_image_section_cache *iscache)
{
	if (!iscache)
		return;

	(void) pt_iscache_clear(iscache);
	free(iscache->name);

#if defined(FEATURE_THREADS)

	mtx_destroy(&iscache->lock);

#endif /* defined(FEATURE_THREADS) */
}